

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void __thiscall Fossilize::StateReplayer::Impl::copy_handle_references(Impl *this,Impl *other)

{
  if (other == this) {
    return;
  }
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,VkSampler_T*>,std::allocator<std::pair<unsigned_long_const,VkSampler_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkSampler_T*>,std::allocator<std::pair<unsigned_long_const,VkSampler_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkSampler_T*>,std::allocator<std::pair<unsigned_long_const,VkSampler_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->replayed_samplers,&(other->replayed_samplers)._M_h);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,VkDescriptorSetLayout_T*>,std::allocator<std::pair<unsigned_long_const,VkDescriptorSetLayout_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkDescriptorSetLayout_T*>,std::allocator<std::pair<unsigned_long_const,VkDescriptorSetLayout_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkDescriptorSetLayout_T*>,std::allocator<std::pair<unsigned_long_const,VkDescriptorSetLayout_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->replayed_descriptor_set_layouts,
             &(other->replayed_descriptor_set_layouts)._M_h);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipelineLayout_T*>,std::allocator<std::pair<unsigned_long_const,VkPipelineLayout_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipelineLayout_T*>,std::allocator<std::pair<unsigned_long_const,VkPipelineLayout_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipelineLayout_T*>,std::allocator<std::pair<unsigned_long_const,VkPipelineLayout_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->replayed_pipeline_layouts,&(other->replayed_pipeline_layouts)._M_h);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,VkShaderModule_T*>,std::allocator<std::pair<unsigned_long_const,VkShaderModule_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkShaderModule_T*>,std::allocator<std::pair<unsigned_long_const,VkShaderModule_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkShaderModule_T*>,std::allocator<std::pair<unsigned_long_const,VkShaderModule_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->replayed_shader_modules,&(other->replayed_shader_modules)._M_h);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,VkRenderPass_T*>,std::allocator<std::pair<unsigned_long_const,VkRenderPass_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkRenderPass_T*>,std::allocator<std::pair<unsigned_long_const,VkRenderPass_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkRenderPass_T*>,std::allocator<std::pair<unsigned_long_const,VkRenderPass_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->replayed_render_passes,&(other->replayed_render_passes)._M_h);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipeline_T*>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipeline_T*>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipeline_T*>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->replayed_compute_pipelines,&(other->replayed_compute_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipeline_T*>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipeline_T*>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipeline_T*>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->replayed_graphics_pipelines,&(other->replayed_graphics_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipeline_T*>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipeline_T*>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,VkPipeline_T*>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->replayed_raytracing_pipelines,&(other->replayed_raytracing_pipelines)._M_h);
  return;
}

Assistant:

void StateReplayer::Impl::copy_handle_references(const StateReplayer::Impl &other)
{
	replayed_samplers = other.replayed_samplers;
	replayed_descriptor_set_layouts = other.replayed_descriptor_set_layouts;
	replayed_pipeline_layouts = other.replayed_pipeline_layouts;
	replayed_shader_modules = other.replayed_shader_modules;
	replayed_render_passes = other.replayed_render_passes;
	replayed_compute_pipelines = other.replayed_compute_pipelines;
	replayed_graphics_pipelines = other.replayed_graphics_pipelines;
	replayed_raytracing_pipelines = other.replayed_raytracing_pipelines;
}